

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O0

void __thiscall QtMWidgets::PageView::PageView(PageView *this,QWidget *parent)

{
  int xp1;
  int yp1;
  int iVar1;
  int iVar2;
  PageViewPrivate *pPVar3;
  ConnectionType type;
  QRect local_c8;
  QRect local_b8;
  code *local_a8;
  undefined8 uStack_a0;
  code *local_98;
  undefined8 local_90;
  Object local_88 [8];
  code *local_80;
  undefined8 uStack_78;
  code *local_70;
  undefined8 local_68;
  Object local_60 [8];
  code *local_58;
  undefined8 uStack_50;
  code *local_48;
  undefined8 local_40;
  undefined1 local_38 [28];
  QFlags<Qt::WindowType> local_1c;
  QWidget *local_18;
  QWidget *parent_local;
  PageView *this_local;
  
  local_18 = parent;
  parent_local = (QWidget *)this;
  QFlags<Qt::WindowType>::QFlags(&local_1c);
  QFrame::QFrame(&this->super_QFrame,parent,(QFlags_conflict1 *)(ulong)local_1c.i);
  *(undefined ***)this = &PTR_metaObject_00233930;
  *(undefined ***)&this->field_0x10 = &PTR__PageView_00233ae8;
  pPVar3 = (PageViewPrivate *)operator_new(0x60);
  PageViewPrivate::PageViewPrivate(pPVar3,this);
  QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>::
  QScopedPointer(&this->d,pPVar3);
  pPVar3 = QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>
           ::operator->(&this->d);
  local_48 = PageControl::currentChanged;
  local_40 = 0;
  local_58 = _q_currentIndexChanged;
  uStack_50 = 0;
  type = (ConnectionType)this;
  QObject::connect<void(QtMWidgets::PageControl::*)(int,int),void(QtMWidgets::PageView::*)(int,int)>
            ((Object *)local_38,(offset_in_PageControl_to_subr)pPVar3->control,
             (Object *)PageControl::currentChanged,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  pPVar3 = QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>
           ::operator->(&this->d);
  local_70 = QVariantAnimation::valueChanged;
  local_68 = 0;
  local_80 = _q_normalizePageAnimation;
  uStack_78 = 0;
  QObject::
  connect<void(QVariantAnimation::*)(QVariant_const&),void(QtMWidgets::PageView::*)(QVariant_const&)>
            (local_60,(offset_in_QVariantAnimation_to_subr)pPVar3->normalizeAnimation,
             (Object *)QVariantAnimation::valueChanged,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  pPVar3 = QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>
           ::operator->(&this->d);
  local_98 = QAbstractAnimation::finished;
  local_90 = 0;
  local_a8 = _q_normalizeAnimationFinished;
  uStack_a0 = 0;
  QObject::connect<void(QAbstractAnimation::*)(),void(QtMWidgets::PageView::*)()>
            (local_88,(offset_in_QAbstractAnimation_to_subr)pPVar3->normalizeAnimation,
             (Object *)QAbstractAnimation::finished,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_88);
  pPVar3 = QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>
           ::operator->(&this->d);
  local_c8 = (QRect)QFrame::frameRect();
  xp1 = QFrame::frameWidth();
  yp1 = QFrame::frameWidth();
  iVar1 = QFrame::frameWidth();
  iVar2 = QFrame::frameWidth();
  local_b8 = QRect::adjusted(&local_c8,xp1,yp1,-iVar1,-iVar2);
  PageViewPrivate::relayoutChildren(pPVar3,&local_b8);
  QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>::
  operator->(&this->d);
  QWidget::raise();
  QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>::
  operator->(&this->d);
  QWidget::show();
  return;
}

Assistant:

PageView::PageView( QWidget * parent )
	:	QFrame( parent )
	,	d( new PageViewPrivate( this ) )
{
	connect( d->control, &PageControl::currentChanged,
		this, &PageView::_q_currentIndexChanged );

	connect( d->normalizeAnimation, &QVariantAnimation::valueChanged,
		this, &PageView::_q_normalizePageAnimation );

	connect( d->normalizeAnimation, &QVariantAnimation::finished,
		this, &PageView::_q_normalizeAnimationFinished );

	d->relayoutChildren( frameRect().adjusted( frameWidth(), frameWidth(),
		-frameWidth(), -frameWidth() ) );

	d->control->raise();

	d->control->show();
}